

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxmacro.h
# Opt level: O1

uint32_t GFX_MEMCPY_S(void *d,int dn,void *s,int n)

{
  if (dn >= n) {
    memcpy(d,s,(long)n);
  }
  return (uint)(dn < n);
}

Assistant:

__S_INLINE uint32_t GFX_MEMCPY_S(void *d, int dn, const void *s, int n)
{
    uint32_t Error;

    // Check for the size, overlapping, etc.
    // Calling code responsibility to avoid overlap regions
    __GFXMACRO_ASSERT(n >= 0);
    __GFXMACRO_ASSERT(
        (((char*) d >= (char*) s) && ((ULONG_PTR)((char*) d - (char*) s) >= (ULONG_PTR) n) ) ||
        (((char*) s >= (char*) d) && ((ULONG_PTR)((char*) s - (char*) d) >= (ULONG_PTR) n) ));

    #ifndef _WIN32
        Error = 0;
        if(n <= dn)
        {
            memcpy(d, s, n);
        }
        else
        {
            Error = !Error;
        }
    #else
        Error = (uint32_t) memcpy_s(d, dn, s, n);
    #endif

    __GFXMACRO_ASSERT(!Error);
    return(Error);
}